

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.cpp
# Opt level: O2

string * __thiscall
lan::db::write_all_bits_abi_cxx11_(string *__return_storage_ptr__,db *this,db_bits *bits)

{
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_40);
  for (; bits != (db_bit *)0x0; bits = bits->nex) {
    write_bit_abi_cxx11_(&local_40,this,bits,false);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string db::write_all_bits(db_bits * bits){
            db_bit * buffer = bits;
            std::string bits_str = "";
            while(buffer){
                bits_str += write_bit(buffer);
                buffer = buffer->nex;
            }
            return bits_str;
        }